

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterEndAttribute(xmlTextWriterPtr writer)

{
  int iVar1;
  xmlLinkPtr lk;
  void *pvVar2;
  
  if ((((writer == (xmlTextWriterPtr)0x0) ||
       (lk = xmlListFront(writer->nodes), lk == (xmlLinkPtr)0x0)) ||
      (pvVar2 = xmlLinkGetData(lk), pvVar2 == (void *)0x0)) || (*(int *)((long)pvVar2 + 8) != 2)) {
    iVar1 = -1;
  }
  else {
    *(undefined4 *)((long)pvVar2 + 8) = 1;
    iVar1 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
    if (iVar1 < 0) {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int
xmlTextWriterEndAttribute(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    DEBUG_ENTER(("xmlTextWriterEndAttribute(%p);\n", writer));

    if (writer == NULL)
        RETURN_INT(-1);

    lk = xmlListFront(writer->nodes);
    if (lk == 0) {
        RETURN_INT(-1);
    }

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0) {
        RETURN_INT(-1);
    }

    sum = 0;
    switch (p->state) {
        case XML_TEXTWRITER_ATTRIBUTE:
            p->state = XML_TEXTWRITER_NAME;

            count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
            if (count < 0) {
                RETURN_INT(-1);
            }
            sum += count;
            break;
        default:
            RETURN_INT(-1);
    }

    RETURN_INT(sum);
}